

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

FCell __thiscall cppforth::Forth::getDataFCell32(Forth *this,CAddr pointer)

{
  Char CVar1;
  uint local_1c;
  float local_18;
  Cell i;
  float value1;
  CAddr pointer_local;
  Forth *this_local;
  
  local_18 = 0.0;
  i = pointer;
  _value1 = this;
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    CVar1 = dataSpaceAt(this,i + local_1c);
    *(Char *)((long)&local_18 + (ulong)local_1c) = CVar1;
  }
  return (double)local_18;
}

Assistant:

FCell getDataFCell32(CAddr pointer){
			float value1{ 0 };
			for (Cell i = 0; i < sizeof(value1); ++i){
				static_cast<unsigned char*>(static_cast<void*>(&value1))[i] = dataSpaceAt(pointer + i);
			}
			return value1;
		}